

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O0

char * get_autoinscription(object_kind *kind,_Bool aware)

{
  _Bool aware_local;
  object_kind *kind_local;
  
  if (kind == (object_kind *)0x0) {
    kind_local = (object_kind *)0x0;
  }
  else if (aware) {
    kind_local = (object_kind *)quark_str(kind->note_aware);
  }
  else {
    kind_local = (object_kind *)quark_str(kind->note_unaware);
  }
  return (char *)kind_local;
}

Assistant:

const char *get_autoinscription(struct object_kind *kind, bool aware)
{
	if (!kind)
		return NULL;
	else if (aware)
		return quark_str(kind->note_aware);
	else 
		return quark_str(kind->note_unaware);
}